

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_config.cpp
# Opt level: O3

void __thiscall duckdb::ClientConfig::SetDefaultStreamingBufferSize(ClientConfig *this)

{
  optional_idx oVar1;
  idx_t iVar2;
  optional_idx memory;
  optional_idx local_210;
  ClientConfig local_208;
  
  oVar1 = FileSystem::GetAvailableMemory();
  local_210 = oVar1;
  switchD_00569a20::default(&local_208,0,0x1e8);
  ClientConfig(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.http_logging_output._M_dataplus._M_p != &local_208.http_logging_output.field_2) {
    operator_delete(local_208.http_logging_output._M_dataplus._M_p);
  }
  if (local_208.result_collector.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.result_collector.super__Function_base._M_manager)
              ((_Any_data *)&local_208.result_collector,(_Any_data *)&local_208.result_collector,
               __destroy_functor);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_208.user_variables._M_h);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_208.set_variables._M_h);
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_208.profiler_settings._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.profiler_save_location._M_dataplus._M_p !=
      &local_208.profiler_save_location.field_2) {
    operator_delete(local_208.profiler_save_location._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.home_directory._M_dataplus._M_p != &local_208.home_directory.field_2) {
    operator_delete(local_208.home_directory._M_dataplus._M_p);
  }
  if (oVar1.index != 0xffffffffffffffff) {
    iVar2 = optional_idx::GetIndex(&local_210);
    if (iVar2 < local_208.streaming_buffer_size) {
      local_208.streaming_buffer_size = iVar2;
    }
  }
  this->streaming_buffer_size = local_208.streaming_buffer_size;
  return;
}

Assistant:

void ClientConfig::SetDefaultStreamingBufferSize() {
	auto memory = FileSystem::GetAvailableMemory();
	auto default_size = ClientConfig().streaming_buffer_size;
	if (!memory.IsValid()) {
		streaming_buffer_size = default_size;
		return;
	}
	streaming_buffer_size = MinValue(memory.GetIndex(), default_size);
}